

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_mdtm(connectdata *conn)

{
  CURLcode CVar1;
  ftp_conn *ftpc;
  Curl_easy *data;
  CURLcode result;
  connectdata *conn_local;
  
  if (((((conn->data->set).get_filetime & 1U) == 0) &&
      ((conn->data->set).timecondition == CURL_TIMECOND_NONE)) ||
     ((conn->proto).ftpc.file == (char *)0x0)) {
    data._4_4_ = ftp_state_type(conn);
  }
  else {
    CVar1 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"MDTM %s",(conn->proto).ftpc.file);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    _state(conn,FTP_MDTM);
    data._4_4_ = CURLE_OK;
  }
  return data._4_4_;
}

Assistant:

static CURLcode ftp_state_mdtm(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  /* Requested time of file or time-depended transfer? */
  if((data->set.get_filetime || data->set.timecondition) && ftpc->file) {

    /* we have requested to get the modified-time of the file, this is a white
       spot as the MDTM is not mentioned in RFC959 */
    PPSENDF(&ftpc->pp, "MDTM %s", ftpc->file);

    state(conn, FTP_MDTM);
  }
  else
    result = ftp_state_type(conn);

  return result;
}